

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRotationGate2.hpp
# Opt level: O1

void __thiscall
qclab::qgates::QRotationGate2<std::complex<float>_>::QRotationGate2
          (QRotationGate2<std::complex<float>_> *this,int *qubits,real_type cos,real_type sin,
          bool fixed)

{
  int iVar1;
  int iVar2;
  char *__assertion;
  
  (this->super_QAdjustable).fixed_ = fixed;
  (this->super_QGate2<std::complex<float>_>).super_QObject<std::complex<float>_>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_00523c60;
  (this->rotation_).angle_.cos_ = cos;
  (this->rotation_).angle_.sin_ = sin;
  iVar2 = *qubits;
  if (iVar2 < 0) {
    __assertion = "qubits[0] >= 0";
  }
  else {
    iVar1 = qubits[1];
    if (-1 < iVar1) {
      if (iVar2 != iVar1) {
        (this->qubits_)._M_elems[0] = qubits[iVar1 < iVar2];
        iVar2 = qubits[1];
        if (qubits[1] < *qubits) {
          iVar2 = *qubits;
        }
        (this->qubits_)._M_elems[1] = iVar2;
        return;
      }
      __assert_fail("qubits[0] != qubits[1]",
                    "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/include/qclab/qgates/QRotationGate2.hpp"
                    ,0x90,
                    "virtual void qclab::qgates::QRotationGate2<std::complex<float>>::setQubits(const int *) [T = std::complex<float>]"
                   );
    }
    __assertion = "qubits[1] >= 0";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/include/qclab/qgates/QRotationGate2.hpp"
                ,0x8f,
                "virtual void qclab::qgates::QRotationGate2<std::complex<float>>::setQubits(const int *) [T = std::complex<float>]"
               );
}

Assistant:

QRotationGate2( const int* qubits , const real_type cos ,
                        const real_type sin , const bool fixed = false )
        : rotation_( cos , sin )
        , QAdjustable( fixed )
        {
          setQubits( qubits ) ;
        }